

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_8x32_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar11;
  ushort uVar12;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  undefined1 auVar13 [16];
  ushort uVar26;
  ushort uVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  __m128i y_select_1;
  int y_mask_1;
  __m128i left_y;
  __m128i y_select;
  int y_mask;
  __m128i left;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  __m128i weighted_px_1;
  __m128i weighted_px_2;
  __m128i weighted_px_3;
  int local_a9c;
  int local_a6c;
  int local_a3c;
  int local_a0c;
  undefined8 *local_978;
  byte local_8b8;
  undefined1 uStack_8b7;
  undefined1 uStack_8b6;
  undefined1 uStack_8b5;
  byte bStack_8b4;
  undefined1 uStack_8b3;
  undefined1 uStack_8b2;
  undefined1 uStack_8b1;
  byte local_878;
  undefined1 uStack_877;
  undefined1 uStack_876;
  undefined1 uStack_875;
  byte bStack_874;
  undefined1 uStack_873;
  undefined1 uStack_872;
  undefined1 uStack_871;
  byte local_838;
  undefined1 uStack_837;
  undefined1 uStack_836;
  undefined1 uStack_835;
  byte bStack_834;
  undefined1 uStack_833;
  undefined1 uStack_832;
  undefined1 uStack_831;
  byte local_7f8;
  undefined1 uStack_7f7;
  undefined1 uStack_7f6;
  undefined1 uStack_7f5;
  byte bStack_7f4;
  undefined1 uStack_7f3;
  undefined1 uStack_7f2;
  undefined1 uStack_7f1;
  ushort uStack_786;
  ushort uStack_784;
  ushort uStack_782;
  ushort uStack_77e;
  ushort uStack_77c;
  ushort uStack_77a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  __m128i left_y_3;
  __m128i y_select_3;
  int y_mask_3;
  __m128i left_y_2;
  __m128i y_select_2;
  int y_mask_2;
  __m128i left_y_1;
  
  bVar2 = *(byte *)(in_RDX + 7);
  uVar10 = (ushort)bVar2;
  uStack_786 = (ushort)bVar2;
  uStack_784 = (ushort)bVar2;
  uStack_782 = (ushort)bVar2;
  uStack_77e = (ushort)bVar2;
  uStack_77c = (ushort)bVar2;
  uStack_77a = (ushort)bVar2;
  sVar28 = uStack_786 * 0x3b;
  sVar29 = uStack_784 * 0x6e;
  sVar30 = uStack_782 * 0x97;
  sVar31 = uVar10 * 0xb7;
  sVar32 = uStack_77e * 0xce;
  sVar33 = uStack_77c * 0xdb;
  sVar34 = uStack_77a * 0xe0;
  uVar1 = *in_RCX;
  local_7f8 = (byte)uVar1;
  uStack_7f7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_7f6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_7f5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_7f4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_7f3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_7f2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_7f1 = (undefined1)((ulong)uVar1 >> 0x38);
  local_978 = in_RDI;
  for (local_a0c = 0x1000100; local_a0c < 0xf0e0f0f; local_a0c = local_a0c + 0x2020202) {
    auVar8._4_4_ = local_a0c;
    auVar8._0_4_ = local_a0c;
    auVar8._12_4_ = local_a0c;
    auVar8._8_4_ = local_a0c;
    auVar9[1] = 0;
    auVar9[0] = local_7f8;
    auVar9[2] = uStack_7f7;
    auVar9[3] = 0;
    auVar9[4] = uStack_7f6;
    auVar9[5] = 0;
    auVar9[6] = uStack_7f5;
    auVar9[7] = 0;
    auVar9[9] = 0;
    auVar9[8] = bStack_7f4;
    auVar9[10] = uStack_7f3;
    auVar9[0xb] = 0;
    auVar9[0xc] = uStack_7f2;
    auVar9[0xd] = 0;
    auVar9[0xe] = uStack_7f1;
    auVar9[0xf] = 0;
    auVar13 = pshufb(auVar9,auVar8);
    local_218 = auVar13._0_2_;
    sStack_216 = auVar13._2_2_;
    sStack_214 = auVar13._4_2_;
    sStack_212 = auVar13._6_2_;
    sStack_210 = auVar13._8_2_;
    sStack_20e = auVar13._10_2_;
    sStack_20c = auVar13._12_2_;
    sStack_20a = auVar13._14_2_;
    uVar11 = uVar10 + local_218 * 0xff + 0x80;
    uVar14 = sVar28 + sStack_216 * 0xc5 + 0x80;
    uVar16 = sVar29 + sStack_214 * 0x92 + 0x80;
    uVar18 = sVar30 + sStack_212 * 0x69 + 0x80;
    uVar20 = sVar31 + sStack_210 * 0x49 + 0x80;
    uVar22 = sVar32 + sStack_20e * 0x32 + 0x80;
    uVar24 = sVar33 + sStack_20c * 0x25 + 0x80;
    uVar26 = sVar34 + sStack_20a * 0x20 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    *local_978 = CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27),
                          CONCAT16((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                   (0xff < uVar25),
                                   CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) -
                                            (0xff < uVar23),
                                            CONCAT14((uVar21 != 0) * (uVar21 < 0x100) *
                                                     (char)(uVar20 >> 8) - (0xff < uVar21),
                                                     CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                              (char)(uVar18 >> 8) - (0xff < uVar19),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_978 = (undefined8 *)(in_RSI + (long)local_978);
  }
  uVar1 = in_RCX[1];
  local_838 = (byte)uVar1;
  uStack_837 = (undefined1)((ulong)uVar1 >> 8);
  uStack_836 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_835 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_834 = (byte)((ulong)uVar1 >> 0x20);
  uStack_833 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_832 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_831 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_a3c = 0x1000100; local_a3c < 0xf0e0f0f; local_a3c = local_a3c + 0x2020202) {
    auVar6._4_4_ = local_a3c;
    auVar6._0_4_ = local_a3c;
    auVar6._12_4_ = local_a3c;
    auVar6._8_4_ = local_a3c;
    auVar7[1] = 0;
    auVar7[0] = local_838;
    auVar7[2] = uStack_837;
    auVar7[3] = 0;
    auVar7[4] = uStack_836;
    auVar7[5] = 0;
    auVar7[6] = uStack_835;
    auVar7[7] = 0;
    auVar7[9] = 0;
    auVar7[8] = bStack_834;
    auVar7[10] = uStack_833;
    auVar7[0xb] = 0;
    auVar7[0xc] = uStack_832;
    auVar7[0xd] = 0;
    auVar7[0xe] = uStack_831;
    auVar7[0xf] = 0;
    auVar13 = pshufb(auVar7,auVar6);
    local_198 = auVar13._0_2_;
    sStack_196 = auVar13._2_2_;
    sStack_194 = auVar13._4_2_;
    sStack_192 = auVar13._6_2_;
    sStack_190 = auVar13._8_2_;
    sStack_18e = auVar13._10_2_;
    sStack_18c = auVar13._12_2_;
    sStack_18a = auVar13._14_2_;
    uVar11 = uVar10 + local_198 * 0xff + 0x80;
    uVar14 = sVar28 + sStack_196 * 0xc5 + 0x80;
    uVar16 = sVar29 + sStack_194 * 0x92 + 0x80;
    uVar18 = sVar30 + sStack_192 * 0x69 + 0x80;
    uVar20 = sVar31 + sStack_190 * 0x49 + 0x80;
    uVar22 = sVar32 + sStack_18e * 0x32 + 0x80;
    uVar24 = sVar33 + sStack_18c * 0x25 + 0x80;
    uVar26 = sVar34 + sStack_18a * 0x20 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    *local_978 = CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27),
                          CONCAT16((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                   (0xff < uVar25),
                                   CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) -
                                            (0xff < uVar23),
                                            CONCAT14((uVar21 != 0) * (uVar21 < 0x100) *
                                                     (char)(uVar20 >> 8) - (0xff < uVar21),
                                                     CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                              (char)(uVar18 >> 8) - (0xff < uVar19),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_978 = (undefined8 *)(in_RSI + (long)local_978);
  }
  uVar1 = in_RCX[2];
  local_878 = (byte)uVar1;
  uStack_877 = (undefined1)((ulong)uVar1 >> 8);
  uStack_876 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_875 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_874 = (byte)((ulong)uVar1 >> 0x20);
  uStack_873 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_872 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_871 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_a6c = 0x1000100; local_a6c < 0xf0e0f0f; local_a6c = local_a6c + 0x2020202) {
    auVar4._4_4_ = local_a6c;
    auVar4._0_4_ = local_a6c;
    auVar4._12_4_ = local_a6c;
    auVar4._8_4_ = local_a6c;
    auVar5[1] = 0;
    auVar5[0] = local_878;
    auVar5[2] = uStack_877;
    auVar5[3] = 0;
    auVar5[4] = uStack_876;
    auVar5[5] = 0;
    auVar5[6] = uStack_875;
    auVar5[7] = 0;
    auVar5[9] = 0;
    auVar5[8] = bStack_874;
    auVar5[10] = uStack_873;
    auVar5[0xb] = 0;
    auVar5[0xc] = uStack_872;
    auVar5[0xd] = 0;
    auVar5[0xe] = uStack_871;
    auVar5[0xf] = 0;
    auVar13 = pshufb(auVar5,auVar4);
    local_118 = auVar13._0_2_;
    sStack_116 = auVar13._2_2_;
    sStack_114 = auVar13._4_2_;
    sStack_112 = auVar13._6_2_;
    sStack_110 = auVar13._8_2_;
    sStack_10e = auVar13._10_2_;
    sStack_10c = auVar13._12_2_;
    sStack_10a = auVar13._14_2_;
    uVar11 = uVar10 + local_118 * 0xff + 0x80;
    uVar14 = sVar28 + sStack_116 * 0xc5 + 0x80;
    uVar16 = sVar29 + sStack_114 * 0x92 + 0x80;
    uVar18 = sVar30 + sStack_112 * 0x69 + 0x80;
    uVar20 = sVar31 + sStack_110 * 0x49 + 0x80;
    uVar22 = sVar32 + sStack_10e * 0x32 + 0x80;
    uVar24 = sVar33 + sStack_10c * 0x25 + 0x80;
    uVar26 = sVar34 + sStack_10a * 0x20 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    *local_978 = CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27),
                          CONCAT16((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                   (0xff < uVar25),
                                   CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) -
                                            (0xff < uVar23),
                                            CONCAT14((uVar21 != 0) * (uVar21 < 0x100) *
                                                     (char)(uVar20 >> 8) - (0xff < uVar21),
                                                     CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                              (char)(uVar18 >> 8) - (0xff < uVar19),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_978 = (undefined8 *)(in_RSI + (long)local_978);
  }
  uVar1 = in_RCX[3];
  local_8b8 = (byte)uVar1;
  uStack_8b7 = (undefined1)((ulong)uVar1 >> 8);
  uStack_8b6 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_8b5 = (undefined1)((ulong)uVar1 >> 0x18);
  bStack_8b4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_8b3 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_8b2 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_8b1 = (undefined1)((ulong)uVar1 >> 0x38);
  for (local_a9c = 0x1000100; local_a9c < 0xf0e0f0f; local_a9c = local_a9c + 0x2020202) {
    auVar13._4_4_ = local_a9c;
    auVar13._0_4_ = local_a9c;
    auVar13._12_4_ = local_a9c;
    auVar13._8_4_ = local_a9c;
    auVar3[1] = 0;
    auVar3[0] = local_8b8;
    auVar3[2] = uStack_8b7;
    auVar3[3] = 0;
    auVar3[4] = uStack_8b6;
    auVar3[5] = 0;
    auVar3[6] = uStack_8b5;
    auVar3[7] = 0;
    auVar3[9] = 0;
    auVar3[8] = bStack_8b4;
    auVar3[10] = uStack_8b3;
    auVar3[0xb] = 0;
    auVar3[0xc] = uStack_8b2;
    auVar3[0xd] = 0;
    auVar3[0xe] = uStack_8b1;
    auVar3[0xf] = 0;
    auVar13 = pshufb(auVar3,auVar13);
    local_98 = auVar13._0_2_;
    sStack_96 = auVar13._2_2_;
    sStack_94 = auVar13._4_2_;
    sStack_92 = auVar13._6_2_;
    sStack_90 = auVar13._8_2_;
    sStack_8e = auVar13._10_2_;
    sStack_8c = auVar13._12_2_;
    sStack_8a = auVar13._14_2_;
    uVar11 = uVar10 + local_98 * 0xff + 0x80;
    uVar14 = sVar28 + sStack_96 * 0xc5 + 0x80;
    uVar16 = sVar29 + sStack_94 * 0x92 + 0x80;
    uVar18 = sVar30 + sStack_92 * 0x69 + 0x80;
    uVar20 = sVar31 + sStack_90 * 0x49 + 0x80;
    uVar22 = sVar32 + sStack_8e * 0x32 + 0x80;
    uVar24 = sVar33 + sStack_8c * 0x25 + 0x80;
    uVar26 = sVar34 + sStack_8a * 0x20 + 0x80;
    uVar12 = uVar11 >> 8;
    uVar15 = uVar14 >> 8;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    *local_978 = CONCAT17((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27),
                          CONCAT16((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) -
                                   (0xff < uVar25),
                                   CONCAT15((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) -
                                            (0xff < uVar23),
                                            CONCAT14((uVar21 != 0) * (uVar21 < 0x100) *
                                                     (char)(uVar20 >> 8) - (0xff < uVar21),
                                                     CONCAT13((uVar19 != 0) * (uVar19 < 0x100) *
                                                              (char)(uVar18 >> 8) - (0xff < uVar19),
                                                              CONCAT12((uVar17 != 0) *
                                                                       (uVar17 < 0x100) *
                                                                       (char)(uVar16 >> 8) -
                                                                       (0xff < uVar17),
                                                                       CONCAT11((uVar15 != 0) *
                                                                                (uVar15 < 0x100) *
                                                                                (char)(uVar14 >> 8)
                                                                                - (0xff < uVar15),
                                                                                (uVar12 != 0) *
                                                                                (uVar12 < 0x100) *
                                                                                (char)(uVar11 >> 8)
                                                                                - (0xff < uVar12))))
                                                    ))));
    local_978 = (undefined8 *)(in_RSI + (long)local_978);
  }
  return;
}

Assistant:

void aom_smooth_h_predictor_8x32_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 8));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 16));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
  left = cvtepu8_epi16(LoadLo8(left_column + 24));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
}